

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionMeasurementModel.hpp
# Opt level: O1

void __thiscall
KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
PositionMeasurementModel
          (PositionMeasurementModel<float,_Kalman::StandardBase> *this,float landmark1x,
          float landmark1y,float landmark2x,float landmark2y)

{
  float *pfVar1;
  PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_> *pPVar2;
  PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pPVar3;
  DenseStorage<float,_6,_2,_3,_0> *pDVar4;
  DenseStorage<float,_4,_2,_2,_0> *pDVar5;
  float local_3c;
  undefined1 auStack_38 [4];
  float landmark1y_local;
  long local_30;
  long local_28;
  long local_20;
  float local_18;
  float local_14;
  float landmark2y_local;
  
  pPVar3 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).
            super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            .super_StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>.P.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>;
  (pPVar3->m_storage).m_data.array[0] = 1.0;
  (pPVar3->m_storage).m_data.array[1] = 0.0;
  pfVar1 = (float *)((long)&(this->
                            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                            ).
                            super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                            .super_StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>
                            .P.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage
                            .m_data + 8);
  pfVar1[0] = 0.0;
  pfVar1[1] = 1.0;
  pPVar2 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>;
  (pPVar2->m_storage).m_data.array[0] = 1.0;
  (pPVar2->m_storage).m_data.array[1] = 0.0;
  pDVar4 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage;
  (pDVar4->m_data).array[2] = 0.0;
  (pDVar4->m_data).array[3] = 1.0;
  pDVar4 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage;
  (pDVar4->m_data).array[4] = 0.0;
  (pDVar4->m_data).array[5] = 0.0;
  pPVar3 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>;
  (pPVar3->m_storage).m_data.array[0] = 1.0;
  (pPVar3->m_storage).m_data.array[1] = 0.0;
  pDVar5 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage;
  (pDVar5->m_data).array[2] = 0.0;
  (pDVar5->m_data).array[3] = 1.0;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ._vptr_MeasurementModel = (_func_int **)&PTR_h_0010ec38;
  _auStack_38 = &this->landmark1;
  local_30 = 0;
  local_28 = 1;
  local_20 = 1;
  (this->landmark1).super_Matrix<float,_2,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = landmark1x
  ;
  local_3c = landmark1y;
  local_18 = landmark2y;
  local_14 = landmark2x;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)auStack_38,&local_3c);
  if ((local_20 + local_30 == 2) && (local_28 == 1)) {
    _auStack_38 = &this->landmark2;
    local_30 = 0;
    local_28 = 1;
    local_20 = 1;
    (_auStack_38->super_Matrix<float,_2,_1>).
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = local_14
    ;
    Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)auStack_38,&local_18);
    if ((local_20 + local_30 == 2) && (local_28 == 1)) {
      pPVar3 = &(this->
                super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                ).V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>;
      (pPVar3->m_storage).m_data.array[0] = 1.0;
      (pPVar3->m_storage).m_data.array[1] = 0.0;
      pDVar5 = &(this->
                super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                ).V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage;
      (pDVar5->m_data).array[2] = 0.0;
      (pDVar5->m_data).array[3] = 1.0;
      return;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 1>>::finished() [MatrixType = Eigen::Matrix<float, 2, 1>]"
               );
}

Assistant:

PositionMeasurementModel(T landmark1x, T landmark1y, T landmark2x, T landmark2y)
    {
        // Save landmark positions
        landmark1 << landmark1x, landmark1y;
        landmark2 << landmark2x, landmark2y;
        
        // Setup noise jacobian. As this one is static, we can define it once
        // and do not need to update it dynamically
        this->V.setIdentity();
    }